

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

SASL_MECHANISMS_HANDLE sasl_mechanisms_create(AMQP_VALUE sasl_server_mechanisms_value)

{
  int iVar1;
  SASL_MECHANISMS_HANDLE sasl_mechanisms;
  AMQP_VALUE value;
  AMQP_VALUE sasl_server_mechanisms_amqp_value;
  
  sasl_mechanisms = (SASL_MECHANISMS_HANDLE)malloc(8);
  if (sasl_mechanisms != (SASL_MECHANISMS_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x40);
    sasl_mechanisms->composite_value = value;
    if (value == (AMQP_VALUE)0x0) {
      free(sasl_mechanisms);
    }
    else {
      iVar1 = amqpvalue_set_composite_item(value,0,sasl_server_mechanisms_value);
      amqpvalue_destroy(sasl_server_mechanisms_value);
      if (iVar1 == 0) {
        return sasl_mechanisms;
      }
      sasl_mechanisms_destroy(sasl_mechanisms);
    }
  }
  return (SASL_MECHANISMS_HANDLE)0x0;
}

Assistant:

SASL_MECHANISMS_HANDLE sasl_mechanisms_create(AMQP_VALUE sasl_server_mechanisms_value)
{
    SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)malloc(sizeof(SASL_MECHANISMS_INSTANCE));
    if (sasl_mechanisms_instance != NULL)
    {
        sasl_mechanisms_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(64);
        if (sasl_mechanisms_instance->composite_value == NULL)
        {
            free(sasl_mechanisms_instance);
            sasl_mechanisms_instance = NULL;
        }
        else
        {
            AMQP_VALUE sasl_server_mechanisms_amqp_value;
            int result = 0;

            sasl_server_mechanisms_amqp_value = sasl_server_mechanisms_value;
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_mechanisms_instance->composite_value, 0, sasl_server_mechanisms_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(sasl_server_mechanisms_amqp_value);
            if (result != 0)
            {
                sasl_mechanisms_destroy(sasl_mechanisms_instance);
                sasl_mechanisms_instance = NULL;
            }
        }
    }

    return sasl_mechanisms_instance;
}